

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

uint16_t __thiscall
xray_re::xr_ogf_v3::motion_io::import_params_new(motion_io *this,xr_reader *r,uint version)

{
  uint16_t uVar1;
  uint32_t uVar2;
  float fVar3;
  uint16_t motion_id;
  uint version_local;
  xr_reader *r_local;
  motion_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  uVar2 = xr_reader::r_u32(r);
  (this->super_xr_skl_motion).m_flags = uVar2;
  uVar1 = xr_reader::r_u16(r);
  (this->super_xr_skl_motion).m_bone_or_part = uVar1;
  uVar1 = xr_reader::r_u16(r);
  fVar3 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_speed = fVar3;
  fVar3 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_power = fVar3;
  fVar3 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_accrue = fVar3;
  fVar3 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_falloff = fVar3;
  return uVar1;
}

Assistant:

inline uint16_t xr_ogf_v3::motion_io::import_params_new(xr_reader& r, unsigned version)
{
	r.r_sz(m_name);
	m_flags = r.r_u32();
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();

	return motion_id;
}